

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O0

void EDCircles::ComputeEllipsePoints(double *pvec,double *px,double *py,int noPoints)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  int _colB;
  double **_B;
  double **_res;
  double **m;
  double **m_00;
  double **_res_00;
  double **_res_01;
  double **_B_00;
  double **_B_01;
  ulong uVar5;
  void *__s;
  double **m_01;
  double **TB;
  double **InvB;
  double **_res_02;
  double **_B_02;
  double **_res_03;
  double dVar6;
  double dVar7;
  double kk;
  int j;
  int i;
  double theta;
  double pi;
  double Axy;
  double Ayy;
  double Axx;
  double Ay;
  double Ax;
  double Ao;
  double **r1;
  double **b;
  double **Aib;
  double **Ai;
  double **A;
  double **uAiu;
  double *lambda;
  double **ss2;
  double **ss1;
  double **Xneg;
  double **Xpos;
  double **B;
  double **L;
  double **Aiu;
  double **u;
  int npts;
  int noPoints_local;
  double *py_local;
  double *px_local;
  double *pvec_local;
  
  u._4_4_ = noPoints;
  if (noPoints % 2 != 0) {
    u._4_4_ = noPoints + -1;
  }
  _colB = u._4_4_ / 2;
  _B = AllocateMatrix(3,_colB + 1);
  _res = AllocateMatrix(3,_colB + 1);
  m = AllocateMatrix(3,_colB + 1);
  m_00 = AllocateMatrix(3,_colB + 1);
  _res_00 = AllocateMatrix(3,_colB + 1);
  _res_01 = AllocateMatrix(3,_colB + 1);
  _B_00 = AllocateMatrix(3,_colB + 1);
  _B_01 = AllocateMatrix(3,_colB + 1);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)(_colB + 1);
  uVar5 = SUB168(auVar4 * ZEXT816(8),0);
  if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  __s = operator_new__(uVar5);
  m_01 = AllocateMatrix(3,_colB + 1);
  TB = AllocateMatrix(3,3);
  InvB = AllocateMatrix(3,3);
  _res_02 = AllocateMatrix(3,2);
  _B_02 = AllocateMatrix(3,2);
  _res_03 = AllocateMatrix(2,2);
  memset(__s,0,(long)(_colB + 1) << 3);
  dVar7 = pvec[6];
  dVar6 = pvec[4];
  dVar1 = pvec[5];
  dVar2 = pvec[3];
  dVar3 = pvec[2];
  TB[1][1] = pvec[1];
  TB[1][2] = dVar3 / 2.0;
  TB[2][1] = dVar3 / 2.0;
  TB[2][2] = dVar2;
  _B_02[1][1] = dVar6;
  _B_02[2][1] = dVar1;
  _j = 0.0;
  for (kk._4_4_ = 1; kk._4_4_ <= _colB; kk._4_4_ = kk._4_4_ + 1) {
    dVar6 = cos(_j);
    _B[1][kk._4_4_] = dVar6;
    dVar6 = sin(_j);
    _B[2][kk._4_4_] = dVar6;
    _j = 3.14781 / (double)_colB + _j;
  }
  inverse(TB,InvB,2);
  AperB(InvB,_B_02,_res_02,2,2,2,1);
  A_TperB(_B_02,_res_02,_res_03,2,1,2,1);
  _res_03[1][1] = dVar7 * -4.0 + _res_03[1][1];
  AperB(InvB,_B,_res,2,2,2,_colB);
  for (kk._4_4_ = 1; kk._4_4_ < 3; kk._4_4_ = kk._4_4_ + 1) {
    for (kk._0_4_ = 1; kk._0_4_ <= _colB; kk._0_4_ = kk._0_4_ + 1) {
      m_01[kk._4_4_][kk._0_4_] = _B[kk._4_4_][kk._0_4_] * _res[kk._4_4_][kk._0_4_];
    }
  }
  for (kk._0_4_ = 1; kk._0_4_ <= _colB; kk._0_4_ = kk._0_4_ + 1) {
    dVar7 = _res_03[1][1] / (m_01[1][kk._0_4_] + m_01[2][kk._0_4_]);
    if (dVar7 < 0.0) {
      *(undefined8 *)((long)__s + (long)kk._0_4_ * 8) = 0xbff0000000000000;
    }
    else {
      dVar7 = sqrt(dVar7);
      *(double *)((long)__s + (long)kk._0_4_ * 8) = dVar7;
    }
  }
  for (kk._0_4_ = 1; kk._0_4_ <= _colB; kk._0_4_ = kk._0_4_ + 1) {
    dVar7 = *(double *)((long)__s + (long)kk._0_4_ * 8);
    m[2][kk._0_4_] = dVar7;
    m[1][kk._0_4_] = dVar7;
  }
  for (kk._0_4_ = 1; kk._0_4_ <= _colB; kk._0_4_ = kk._0_4_ + 1) {
    m_00[1][kk._0_4_] = _B_02[1][1];
    m_00[2][kk._0_4_] = _B_02[2][1];
  }
  for (kk._0_4_ = 1; kk._0_4_ <= _colB; kk._0_4_ = kk._0_4_ + 1) {
    _B_00[1][kk._0_4_] = (m[1][kk._0_4_] * _B[1][kk._0_4_] + -m_00[1][kk._0_4_]) * 0.5;
    _B_00[2][kk._0_4_] = (m[2][kk._0_4_] * _B[2][kk._0_4_] + -m_00[2][kk._0_4_]) * 0.5;
    _B_01[1][kk._0_4_] = (-m[1][kk._0_4_] * _B[1][kk._0_4_] + -m_00[1][kk._0_4_]) * 0.5;
    _B_01[2][kk._0_4_] = (-m[2][kk._0_4_] * _B[2][kk._0_4_] + -m_00[2][kk._0_4_]) * 0.5;
  }
  AperB(InvB,_B_00,_res_00,2,2,2,_colB);
  AperB(InvB,_B_01,_res_01,2,2,2,_colB);
  for (kk._0_4_ = 1; kk._0_4_ <= _colB; kk._0_4_ = kk._0_4_ + 1) {
    dVar7 = *(double *)((long)__s + (long)kk._0_4_ * 8);
    if ((dVar7 != -1.0) || (NAN(dVar7))) {
      px[kk._0_4_ + -1] = _res_00[1][kk._0_4_];
      py[kk._0_4_ + -1] = _res_00[2][kk._0_4_];
      px[kk._0_4_ + -1 + _colB] = _res_01[1][kk._0_4_];
      py[kk._0_4_ + -1 + _colB] = _res_01[2][kk._0_4_];
    }
    else {
      px[kk._0_4_ + -1] = -1.0;
      py[kk._0_4_ + -1] = -1.0;
      px[kk._0_4_ + -1 + _colB] = -1.0;
      py[kk._0_4_ + -1 + _colB] = -1.0;
    }
  }
  DeallocateMatrix(_B,3);
  DeallocateMatrix(_res,3);
  DeallocateMatrix(m,3);
  DeallocateMatrix(m_00,3);
  DeallocateMatrix(_res_00,3);
  DeallocateMatrix(_res_01,3);
  DeallocateMatrix(_B_00,3);
  DeallocateMatrix(_B_01,3);
  if (__s != (void *)0x0) {
    operator_delete__(__s);
  }
  DeallocateMatrix(m_01,3);
  DeallocateMatrix(TB,3);
  DeallocateMatrix(InvB,3);
  DeallocateMatrix(_res_02,3);
  DeallocateMatrix(_B_02,3);
  DeallocateMatrix(_res_03,2);
  return;
}

Assistant:

void EDCircles::ComputeEllipsePoints(double * pvec, double * px, double * py, int noPoints)
{
	if (noPoints % 2) noPoints--;
	int npts = noPoints / 2;

	double **u = AllocateMatrix(3, npts + 1);
	double **Aiu = AllocateMatrix(3, npts + 1);
	double **L = AllocateMatrix(3, npts + 1);
	double **B = AllocateMatrix(3, npts + 1);
	double **Xpos = AllocateMatrix(3, npts + 1);
	double **Xneg = AllocateMatrix(3, npts + 1);
	double **ss1 = AllocateMatrix(3, npts + 1);
	double **ss2 = AllocateMatrix(3, npts + 1);
	double *lambda = new double[npts + 1];
	double **uAiu = AllocateMatrix(3, npts + 1);
	double **A = AllocateMatrix(3, 3);
	double **Ai = AllocateMatrix(3, 3);
	double **Aib = AllocateMatrix(3, 2);
	double **b = AllocateMatrix(3, 2);
	double **r1 = AllocateMatrix(2, 2);
	double Ao, Ax, Ay, Axx, Ayy, Axy;

	double pi = 3.14781;
	double theta;
	int i;
	int j;
	double kk;

	memset(lambda, 0, sizeof(double)*(npts + 1));

	Ao = pvec[6];
	Ax = pvec[4];
	Ay = pvec[5];
	Axx = pvec[1];
	Ayy = pvec[3];
	Axy = pvec[2];

	A[1][1] = Axx; A[1][2] = Axy / 2;
	A[2][1] = Axy / 2; A[2][2] = Ayy;
	b[1][1] = Ax; b[2][1] = Ay;

	// Generate normals linspace
	for (i = 1, theta = 0.0; i <= npts; i++, theta += (pi / npts))
	{
		u[1][i] = cos(theta);
		u[2][i] = sin(theta);
	}

	inverse(A, Ai, 2);

	AperB(Ai, b, Aib, 2, 2, 2, 1);
	A_TperB(b, Aib, r1, 2, 1, 2, 1);
	r1[1][1] = r1[1][1] - 4 * Ao;

	AperB(Ai, u, Aiu, 2, 2, 2, npts);
	for (i = 1; i <= 2; i++)
		for (j = 1; j <= npts; j++)
			uAiu[i][j] = u[i][j] * Aiu[i][j];

	for (j = 1; j <= npts; j++)
	{
		if ((kk = (r1[1][1] / (uAiu[1][j] + uAiu[2][j]))) >= 0.0)
			lambda[j] = sqrt(kk);
		else
			lambda[j] = -1.0;
	}

	// Builds up B and L
	for (j = 1; j <= npts; j++)
		L[1][j] = L[2][j] = lambda[j];
	for (j = 1; j <= npts; j++)
	{
		B[1][j] = b[1][1];
		B[2][j] = b[2][1];
	}

	for (j = 1; j <= npts; j++)
	{
		ss1[1][j] = 0.5 * (L[1][j] * u[1][j] - B[1][j]);
		ss1[2][j] = 0.5 * (L[2][j] * u[2][j] - B[2][j]);
		ss2[1][j] = 0.5 * (-L[1][j] * u[1][j] - B[1][j]);
		ss2[2][j] = 0.5 * (-L[2][j] * u[2][j] - B[2][j]);
	}

	AperB(Ai, ss1, Xpos, 2, 2, 2, npts);
	AperB(Ai, ss2, Xneg, 2, 2, 2, npts);

	for (j = 1; j <= npts; j++)
	{
		if (lambda[j] == -1.0)
		{
			px[j - 1] = -1;
			py[j - 1] = -1;
			px[j - 1 + npts] = -1;
			py[j - 1 + npts] = -1;
		}
		else
		{
			px[j - 1] = Xpos[1][j];
			py[j - 1] = Xpos[2][j];
			px[j - 1 + npts] = Xneg[1][j];
			py[j - 1 + npts] = Xneg[2][j];
		}
	}

	DeallocateMatrix(u, 3);
	DeallocateMatrix(Aiu, 3);
	DeallocateMatrix(L, 3);
	DeallocateMatrix(B, 3);
	DeallocateMatrix(Xpos, 3);
	DeallocateMatrix(Xneg, 3);
	DeallocateMatrix(ss1, 3);
	DeallocateMatrix(ss2, 3);
	delete[] lambda;
	DeallocateMatrix(uAiu, 3);
	DeallocateMatrix(A, 3);
	DeallocateMatrix(Ai, 3);
	DeallocateMatrix(Aib, 3);
	DeallocateMatrix(b, 3);
	DeallocateMatrix(r1, 2);
}